

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O1

int Sbm_ManCheckSol(Sbm_Man_t *p,Vec_Int_t *vSol)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  char *__format;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  p->vPolar->nSize = 0;
  pVVar5 = p->vLit2Used;
  uVar7 = (long)p->nInputs + (long)p->vObjCuts->nSize;
  iVar6 = (int)uVar7;
  if (pVVar5->nCap < iVar6) {
    if (pVVar5->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(uVar7 * 4);
    }
    else {
      piVar4 = (int *)realloc(pVVar5->pArray,uVar7 * 4);
    }
    pVVar5->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar6;
  }
  if (0 < iVar6) {
    memset(pVVar5->pArray,0,(uVar7 & 0xffffffff) << 2);
  }
  pVVar5->nSize = iVar6;
  pVVar5 = p->vSolCuts;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      iVar6 = pVVar5->pArray[lVar10];
      lVar9 = (long)iVar6;
      if (lVar9 < 0) {
        uVar8 = -iVar6;
        uVar2 = p->vLit2Used->nSize;
        if (uVar2 == uVar8 || SBORROW4(uVar2,uVar8) != (int)(uVar2 + iVar6) < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4 = p->vLit2Used->pArray + uVar8;
LAB_00769358:
        *piVar4 = 1;
        Vec_IntPush(p->vPolar,uVar8);
      }
      else {
        Vec_IntPush(p->vPolar,p->FirstVar + iVar6);
        if (p->vCuts->nSize <= iVar6) goto LAB_00769553;
        pVVar5 = p->vCuts->pArray;
        if (((pVVar5[lVar9].nSize < 1) ||
            (uVar8 = *pVVar5[lVar9].pArray - p->LitShift, (int)uVar8 < 0)) ||
           (p->vLit2Used->nSize <= (int)uVar8)) goto LAB_007694f6;
        piVar4 = p->vLit2Used->pArray;
        if (piVar4[uVar8] == 0) {
          piVar4 = piVar4 + uVar8;
          goto LAB_00769358;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->vSolCuts;
    } while (lVar10 < pVVar5->nSize);
  }
  pVVar5 = p->vRoots;
  if (pVVar5->nSize < 1) {
    iVar6 = 1;
  }
  else {
    iVar6 = 1;
    lVar10 = 0;
    do {
      iVar1 = pVVar5->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->vLit2Used->nSize <= iVar1)) {
LAB_007694f6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vLit2Used->pArray[iVar1] == 0) {
        iVar6 = 0;
        printf("Output literal %d has no cut.\n");
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->vRoots;
    } while (lVar10 < pVVar5->nSize);
  }
  pVVar5 = p->vSolCuts;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      uVar2 = pVVar5->pArray[lVar10];
      lVar9 = (long)(int)uVar2;
      if (-1 < lVar9) {
        if (p->vCuts->nSize <= (int)uVar2) {
LAB_00769553:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar5 = p->vCuts->pArray;
        if (1 < pVVar5[lVar9].nSize) {
          lVar11 = 1;
          do {
            uVar8 = pVVar5[lVar9].pArray[lVar11];
            uVar3 = uVar8 - p->LitShift;
            if ((int)uVar3 < 0) {
              if ((int)uVar8 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar8 & 1) == 0) {
                __assert_fail("Abc_LitIsCompl(Lit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaSatMap.c"
                              ,0x7e,"int Sbm_ManCheckSol(Sbm_Man_t *, Vec_Int_t *)");
              }
              uVar8 = uVar8 >> 1;
              iVar1 = p->vObjCuts->nSize;
              uVar3 = iVar1 + uVar8;
              if ((uVar3 == 0 || SCARRY4(iVar1,uVar8) != (int)uVar3 < 0) ||
                 (p->vLit2Used->nSize < (int)uVar3)) goto LAB_007694f6;
              if (p->vLit2Used->pArray[(ulong)uVar3 - 1] == 0) {
                uVar3 = uVar8 - 1;
                __format = "Inverter of input %d of cut %d is not mapped.\n";
                goto LAB_007694a7;
              }
            }
            else {
              if (p->vLit2Used->nSize <= (int)uVar3) goto LAB_007694f6;
              if (p->vLit2Used->pArray[uVar3] == 0) {
                __format = "Internal literal %d of cut %d is not mapped.\n";
LAB_007694a7:
                iVar6 = 0;
                printf(__format,(ulong)uVar3,(ulong)uVar2);
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar5[lVar9].nSize);
        }
        Vec_IntPush(p->vPolar,uVar2 + p->FirstVar);
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->vSolCuts;
    } while (lVar10 < pVVar5->nSize);
  }
  return iVar6;
}

Assistant:

int Sbm_ManCheckSol( Sbm_Man_t * p, Vec_Int_t * vSol )
{
    //int K = Vec_IntSize(vSol) - 1;
    int i, j, Lit, Cut;
    int RetValue = 1;
    Vec_Int_t * vCut;
    // clear polarity and assumptions
    Vec_IntClear( p->vPolar );
    // mark used literals
    Vec_IntFill( p->vLit2Used, Vec_WecSize(p->vObjCuts) + p->nInputs, 0 );
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 ) // input inverter variable
        {
            Vec_IntWriteEntry( p->vLit2Used, -Cut, 1 );
            Vec_IntPush( p->vPolar, -Cut ); 
            continue;
        }
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); 
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Lit = Vec_IntEntry( vCut, 0 ) - p->LitShift; // obj literal
        if ( Vec_IntEntry(p->vLit2Used, Lit) )
            continue;
        Vec_IntWriteEntry( p->vLit2Used, Lit, 1 );
        Vec_IntPush( p->vPolar, Lit ); // literal variable
    }
    // check that the output literals are used
    Vec_IntForEachEntry( p->vRoots, Lit, i )
    {
        if ( Vec_IntEntry(p->vLit2Used, Lit) == 0 )
            printf( "Output literal %d has no cut.\n", Lit ), RetValue = 0;
    }
    // check internal nodes
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 )
            continue;
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Vec_IntForEachEntryStart( vCut, Lit, j, 1 )
            if ( Lit - p->LitShift < 0 )
            {
                assert( Abc_LitIsCompl(Lit) );
                if ( Vec_IntEntry(p->vLit2Used, Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1) == 0 )
                    printf( "Inverter of input %d of cut %d is not mapped.\n", Abc_Lit2Var(Lit)-1, Cut ), RetValue = 0;
            }
            else if ( Vec_IntEntry(p->vLit2Used, Lit - p->LitShift) == 0 )
                printf( "Internal literal %d of cut %d is not mapped.\n", Lit - p->LitShift, Cut ), RetValue = 0;
        // create polarity
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); // cut variable
    }
    return RetValue;
}